

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

bool unicodeVerticalWhitespace(uint c)

{
  undefined1 local_d;
  uint c_local;
  
  local_d = true;
  if ((((c != 10) && (local_d = true, c != 0xb)) && (local_d = true, c != 0xc)) &&
     (((local_d = true, c != 0xd && (local_d = true, c != 0x85)) && (local_d = true, c != 0x2028))))
  {
    local_d = c == 0x2029;
  }
  return local_d;
}

Assistant:

bool unicodeVerticalWhitespace (unsigned int c)
{
  return (c == 0x000A ||   // Common  Other, control  LF, Line feed
          c == 0x000B ||   // Common  Other, control  VT, Vertical Tab
          c == 0x000C ||   // Common  Other, control  FF, Form feed
          c == 0x000D ||   // Common  Other, control  CR, Carriage return
          c == 0x0085 ||   // Common  Other, control  NEL, Next line
          c == 0x2028 ||   // line separator  Common  Separator, line
          c == 0x2029);    // paragraph separator Common  Separator, paragraph
}